

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetime.cpp
# Opt level: O2

void refreshZonedDateTime(QDateTimeData *d,QTimeZone *zone,TransitionOptions resolve)

{
  QDateTimePrivate *pQVar1;
  uint uVar2;
  uint uVar3;
  undefined1 *millis;
  int iVar4;
  long in_FS_OFFSET;
  undefined1 local_48 [12];
  DaylightStatus DStack_3c;
  undefined1 *local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = d->d;
  if (((ulong)pQVar1 & 1) == 0) {
    uVar2 = (pQVar1->m_status).super_QFlagsStorageHelper<QDateTimePrivate::StatusFlag,_4>.
            super_QFlagsStorage<QDateTimePrivate::StatusFlag>.i;
    if ((~uVar2 & 6) == 0) {
      millis = (undefined1 *)pQVar1->m_msecs;
LAB_001220e0:
      local_38 = &DAT_aaaaaaaaaaaaaaaa;
      local_48._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      stack0xffffffffffffffc0 = &DAT_aaaaaaaaaaaaaaaa;
      stateAtMillis((ZoneState *)local_48,zone,(qint64)millis,resolve);
      if ((DStack_3c != UnknownDaylightTime) && (local_38._0_1_ == true)) {
        uVar2 = uVar2 & 0xffffff3f;
        if (DStack_3c == StandardTime) {
          uVar2 = uVar2 | 0x40;
        }
        else if (DStack_3c == DaylightTime) {
          uVar2 = uVar2 | 0x80;
        }
        iVar4 = local_48._8_4_;
        uVar3 = uVar2 | 8;
        if (millis != (undefined1 *)local_48._0_8_) {
          if ((uVar2 & 1) != 0) {
            if ((ulong)(local_48._0_8_ + 0x80000000000000) >> 0x38 == 0) {
              d->d = (QDateTimePrivate *)(local_48._0_8_ << 8 | (ulong)*(byte *)d);
            }
            else {
              uVar3 = uVar2 & 0xfffffffe | 8;
              QDateTime::Data::detach((Data *)&d->data);
            }
          }
          if ((uVar3 & 1) == 0) {
            d->d->m_msecs = local_48._0_8_;
          }
        }
        goto LAB_00122137;
      }
    }
  }
  else {
    uVar2 = (uint)(byte)pQVar1;
    if ((~(uint)pQVar1 & 6) == 0) {
      millis = (undefined1 *)((long)pQVar1 >> 8);
      goto LAB_001220e0;
    }
  }
  uVar3 = uVar2 & 0xfffffff7;
  iVar4 = 0;
LAB_00122137:
  if ((uVar3 & 1) == 0) {
    (d->d->m_status).super_QFlagsStorageHelper<QDateTimePrivate::StatusFlag,_4>.
    super_QFlagsStorage<QDateTimePrivate::StatusFlag>.i = uVar3;
    d->d->m_offsetFromUtc = iVar4;
  }
  else {
    *(char *)d = (char)uVar3;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void refreshZonedDateTime(QDateTimeData &d, const QTimeZone &zone,
                                 QDateTimePrivate::TransitionOptions resolve)
{
    Q_ASSERT(zone.timeSpec() == Qt::TimeZone || zone.timeSpec() == Qt::LocalTime);
    auto status = getStatus(d);
    Q_ASSERT(extractSpec(status) == zone.timeSpec());
    int offsetFromUtc = 0;
    /* Callers are:
       * QDTP::create(), where d is too new to be shared yet
       * reviseTimeZone(), which detach()es if not short before calling this
       * checkValidDateTime(), always follows a setDateTime() that detach()ed if not short

       So we can assume d is not shared. We only need to detach() if we convert
       from short to pimpled to accommodate an oversize msecs, which can only be
       needed in the unlikely event we revise it.
    */

    // If not valid date and time then is invalid
    if (!status.testFlags(QDateTimePrivate::ValidDate | QDateTimePrivate::ValidTime)) {
        status.setFlag(QDateTimePrivate::ValidDateTime, false);
    } else {
        // We have a valid date and time and a Qt::LocalTime or Qt::TimeZone
        // that might fall into a "missing" DST transition hour.
        qint64 msecs = getMSecs(d);
        QDateTimePrivate::ZoneState state = stateAtMillis(zone, msecs, resolve);
        Q_ASSERT(!state.valid || (state.offset >= -SECS_PER_DAY && state.offset <= SECS_PER_DAY));
        if (state.dst == QDateTimePrivate::UnknownDaylightTime) { // Overflow
            status.setFlag(QDateTimePrivate::ValidDateTime, false);
        } else if (state.valid) {
            status = mergeDaylightStatus(status, state.dst);
            offsetFromUtc = state.offset;
            status.setFlag(QDateTimePrivate::ValidDateTime, true);
            if (Q_UNLIKELY(msecs != state.when)) {
                // Update msecs to the resolution:
                if (status.testFlag(QDateTimePrivate::ShortData)) {
                    if (msecsCanBeSmall(state.when)) {
                        d.data.msecs = qintptr(state.when);
                    } else {
                        // Convert to long-form so we can hold the revised msecs:
                        status.setFlag(QDateTimePrivate::ShortData, false);
                        d.detach();
                    }
                }
                if (!status.testFlag(QDateTimePrivate::ShortData))
                    d->m_msecs = state.when;
            }
        } else {
            status.setFlag(QDateTimePrivate::ValidDateTime, false);
        }
    }

    if (status.testFlag(QDateTimePrivate::ShortData)) {
        d.data.status = status.toInt();
    } else {
        d->m_status = status;
        d->m_offsetFromUtc = offsetFromUtc;
    }
}